

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxy_connect(Curl_easy *data,int sockindex)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  uint local_3c;
  CURLcode result_1;
  int remote_port;
  char *hostname;
  CURLcode result;
  connectdata *conn;
  int sockindex_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if (((pcVar1->http_proxy).proxytype != CURLPROXY_HTTPS) ||
     ((data_local._4_4_ = https_proxy_connect(data,sockindex), data_local._4_4_ == CURLE_OK &&
      (((pcVar1->bits).proxy_ssl_connected[sockindex] & 1U) != 0)))) {
    if (((*(ulong *)&(pcVar1->bits).field_0x4 >> 3 & 1) != 0) &&
       ((*(ulong *)&(pcVar1->bits).field_0x4 & 1) != 0)) {
      if ((*(ulong *)&(pcVar1->bits).field_0x4 >> 8 & 1) == 0) {
        if (sockindex == 1) {
          _result_1 = pcVar1->secondaryhostname;
        }
        else {
          _result_1 = (pcVar1->host).name;
        }
      }
      else {
        _result_1 = (pcVar1->conn_to_host).name;
      }
      if (sockindex == 1) {
        local_3c = (uint)pcVar1->secondary_port;
      }
      else if ((*(ulong *)&(pcVar1->bits).field_0x4 >> 9 & 1) == 0) {
        local_3c = pcVar1->remote_port;
      }
      else {
        local_3c = pcVar1->conn_to_port;
      }
      CVar2 = Curl_proxyCONNECT(data,sockindex,_result_1,local_3c);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      (*Curl_cfree)((data->state).aptr.proxyuserpwd);
      (data->state).aptr.proxyuserpwd = (char *)0x0;
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_proxy_connect(struct Curl_easy *data, int sockindex)
{
  struct connectdata *conn = data->conn;
  if(conn->http_proxy.proxytype == CURLPROXY_HTTPS) {
    const CURLcode result = https_proxy_connect(data, sockindex);
    if(result)
      return result;
    if(!conn->bits.proxy_ssl_connected[sockindex])
      return result; /* wait for HTTPS proxy SSL initialization to complete */
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    const char *hostname;
    int remote_port;
    CURLcode result;

    /* We want "seamless" operations through HTTP proxy tunnel */

    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */

    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else if(sockindex == SECONDARYSOCKET)
      hostname = conn->secondaryhostname;
    else
      hostname = conn->host.name;

    if(sockindex == SECONDARYSOCKET)
      remote_port = conn->secondary_port;
    else if(conn->bits.conn_to_port)
      remote_port = conn->conn_to_port;
    else
      remote_port = conn->remote_port;

    result = Curl_proxyCONNECT(data, sockindex, hostname, remote_port);
    if(CURLE_OK != result)
      return result;
    Curl_safefree(data->state.aptr.proxyuserpwd);
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}